

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_subx_8_rr(void)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  puVar3 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xff;
  uVar2 = *puVar3 & 0xff;
  m68ki_cpu.x_flag = (uVar2 - uVar1) - (m68ki_cpu.x_flag >> 8 & 1);
  m68ki_cpu.v_flag = (uVar1 ^ uVar2) & (m68ki_cpu.x_flag ^ uVar2);
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff | m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar3 = *puVar3 & 0xffffff00 | m68ki_cpu.x_flag & 0xff;
  return;
}

Assistant:

static void m68k_op_subx_8_rr(void)
{
	uint* r_dst = &DX;
	uint src = MASK_OUT_ABOVE_8(DY);
	uint dst = MASK_OUT_ABOVE_8(*r_dst);
	uint res = dst - src - XFLAG_AS_1();

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;
}